

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WindowImplX11.cpp
# Opt level: O1

void __thiscall sf::priv::WindowImplX11::setTitle(WindowImplX11 *this,String *title)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Window WVar2;
  Display *pDVar3;
  _Alloc_hider _Var4;
  ConstIterator CVar5;
  ConstIterator CVar6;
  back_insert_iterator<std::__cxx11::basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>_>
  output;
  Atom AVar7;
  Atom AVar8;
  string local_a0;
  locale local_80 [8];
  locale local_78 [8];
  basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>
  utf8Title;
  string local_50;
  
  utf8Title._M_dataplus._M_p = (pointer)&utf8Title.field_2;
  utf8Title._M_string_length = 0;
  utf8Title.field_2._M_local_buf[0] = '\0';
  CVar5 = String::begin_abi_cxx11_(title);
  CVar6 = String::end_abi_cxx11_(title);
  if (CVar5._M_current < CVar6._M_current) {
    output.container = &utf8Title;
    do {
      output = Utf<8u>::
               encode<std::back_insert_iterator<std::__cxx11::basic_string<unsigned_char,std::char_traits<unsigned_char>,std::allocator<unsigned_char>>>>
                         (*CVar5._M_current,output,'\0');
      CVar5._M_current = CVar5._M_current + 1;
    } while (CVar5._M_current < CVar6._M_current);
  }
  paVar1 = &local_a0.field_2;
  local_a0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"UTF8_STRING","");
  AVar7 = getAtom(&local_a0,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != paVar1) {
    operator_delete(local_a0._M_dataplus._M_p);
  }
  local_a0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"_NET_WM_NAME","");
  AVar8 = getAtom(&local_a0,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != paVar1) {
    operator_delete(local_a0._M_dataplus._M_p);
  }
  XChangeProperty(this->m_display,this->m_window,AVar8,AVar7,8,0,utf8Title._M_dataplus._M_p,
                  utf8Title._M_string_length & 0xffffffff);
  local_a0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"_NET_WM_ICON_NAME","");
  AVar8 = getAtom(&local_a0,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != paVar1) {
    operator_delete(local_a0._M_dataplus._M_p);
  }
  XChangeProperty(this->m_display,this->m_window,AVar8,AVar7,8,0,utf8Title._M_dataplus._M_p,
                  utf8Title._M_string_length & 0xffffffff);
  WVar2 = this->m_window;
  pDVar3 = this->m_display;
  std::locale::locale(local_78);
  String::toAnsiString_abi_cxx11_(&local_a0,title,local_78);
  _Var4._M_p = local_a0._M_dataplus._M_p;
  std::locale::locale(local_80);
  String::toAnsiString_abi_cxx11_(&local_50,title,local_80);
  Xutf8SetWMProperties(pDVar3,WVar2,_Var4._M_p,local_50._M_dataplus._M_p,0,0,0,0,0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  std::locale::~locale(local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != paVar1) {
    operator_delete(local_a0._M_dataplus._M_p);
  }
  std::locale::~locale(local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>_11
       *)utf8Title._M_dataplus._M_p != &utf8Title.field_2) {
    operator_delete(utf8Title._M_dataplus._M_p);
  }
  return;
}

Assistant:

void WindowImplX11::setTitle(const String& title)
{
    // Bare X11 has no Unicode window title support.
    // There is however an option to tell the window manager your Unicode title via hints.

    // Convert to UTF-8 encoding.
    std::basic_string<Uint8> utf8Title;
    Utf32::toUtf8(title.begin(), title.end(), std::back_inserter(utf8Title));

    Atom useUtf8 = getAtom("UTF8_STRING", false);

    // Set the _NET_WM_NAME atom, which specifies a UTF-8 encoded window title.
    Atom wmName = getAtom("_NET_WM_NAME", false);
    XChangeProperty(m_display, m_window, wmName, useUtf8, 8,
                    PropModeReplace, utf8Title.c_str(), static_cast<int>(utf8Title.size()));

    // Set the _NET_WM_ICON_NAME atom, which specifies a UTF-8 encoded window title.
    Atom wmIconName = getAtom("_NET_WM_ICON_NAME", false);
    XChangeProperty(m_display, m_window, wmIconName, useUtf8, 8,
                    PropModeReplace, utf8Title.c_str(), static_cast<int>(utf8Title.size()));

    // Set the non-Unicode title as a fallback for window managers who don't support _NET_WM_NAME.
    #ifdef X_HAVE_UTF8_STRING
    Xutf8SetWMProperties(m_display,
                         m_window,
                         title.toAnsiString().c_str(),
                         title.toAnsiString().c_str(),
                         NULL,
                         0,
                         NULL,
                         NULL,
                         NULL);
    #else
    XmbSetWMProperties(m_display,
                       m_window,
                       title.toAnsiString().c_str(),
                       title.toAnsiString().c_str(),
                       NULL,
                       0,
                       NULL,
                       NULL,
                       NULL);
    #endif
}